

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  int _d;
  int iVar1;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  void *pvVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  undefined1 (*pauVar28) [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  iVar13 = (this->super_Cast).type_from;
  iVar12 = (this->super_Cast).type_to;
  if (iVar13 == iVar12) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar13 = bottom_blob->w;
      iVar12 = bottom_blob->h;
      iVar22 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar13;
      top_blob->h = iVar12;
      top_blob->d = iVar22;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar13 = 0;
    }
  }
  else {
    iVar22 = bottom_blob->w;
    _h = bottom_blob->h;
    _d = bottom_blob->d;
    uVar16 = bottom_blob->c;
    iVar1 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar17 = (size_t)_elempack;
    switch(iVar12) {
    case 1:
      if (iVar13 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar17 = sVar17 * 4;
      break;
    case 2:
    case 4:
      sVar17 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar17 = bottom_blob->elemsize;
    }
    switch(iVar1) {
    case 1:
      Mat::create(top_blob,iVar22,sVar17,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar22,_h,sVar17,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar22,_h,uVar16,sVar17,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar22,_h,_d,uVar16,sVar17,_elempack,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (((this->super_Cast).type_from == 1) &&
         (((this->super_Cast).type_to == 2 && (iVar13 = bottom_blob->c, 0 < (long)iVar13)))) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          pauVar19 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar28 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar25 < 8) {
            uVar24 = 0;
          }
          else {
            iVar12 = 7;
            do {
              auVar30 = vcvtps2ph_f16c(*pauVar19,8);
              *pauVar28 = auVar30;
              pauVar19 = pauVar19 + 1;
              pauVar28 = pauVar28 + 1;
              iVar12 = iVar12 + 8;
              uVar24 = uVar25 & 0xfffffff8;
            } while (iVar12 < (int)uVar25);
          }
          uVar15 = uVar24 | 3;
          while ((int)uVar15 < (int)uVar25) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar19,8);
            pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            uVar15 = uVar24 + 7;
            uVar24 = uVar24 + 4;
          }
          if (uVar25 - uVar24 != 0 && (int)uVar24 <= (int)uVar25) {
            lVar27 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              uVar11 = float32_to_float16(*(float *)(*pauVar19 + lVar27 * 4));
              *(unsigned_short *)(*pauVar28 + lVar27 * 2) = uVar11;
              lVar27 = lVar27 + 1;
            } while (uVar25 - uVar24 != (int)lVar27);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar13);
      }
      auVar30 = in_ZMM3._0_16_;
      if ((((this->super_Cast).type_from == 2) && ((this->super_Cast).type_to == 1)) &&
         (iVar13 = bottom_blob->c, 0 < (long)iVar13)) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          pauVar28 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar19 = (undefined1 (*) [32])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar25 < 8) {
            uVar24 = 0;
          }
          else {
            iVar12 = 7;
            do {
              auVar8 = vcvtph2ps_f16c(*pauVar28);
              *pauVar19 = auVar8;
              pauVar28 = pauVar28 + 1;
              pauVar19 = pauVar19 + 1;
              iVar12 = iVar12 + 8;
              uVar24 = uVar25 & 0xfffffff8;
            } while (iVar12 < (int)uVar25);
          }
          uVar15 = uVar24 | 3;
          while ((int)uVar15 < (int)uVar25) {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)*pauVar28;
            auVar30 = vcvtph2ps_f16c(auVar30);
            *(undefined1 (*) [16])*pauVar19 = auVar30;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
            uVar15 = uVar24 + 7;
            uVar24 = uVar24 + 4;
          }
          if (uVar25 - uVar24 != 0 && (int)uVar24 <= (int)uVar25) {
            lVar27 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              fVar29 = float16_to_float32(*(unsigned_short *)(*pauVar28 + lVar27 * 2));
              *(float *)(*pauVar19 + lVar27 * 4) = fVar29;
              lVar27 = lVar27 + 1;
            } while (uVar25 - uVar24 != (int)lVar27);
          }
          auVar30 = in_ZMM3._0_16_;
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar13);
      }
      if (0 < (int)uVar16 && ((this->super_Cast).type_to == 1 && (this->super_Cast).type_from == 3))
      {
        uVar25 = _d * _elempack * _h * iVar22;
        pvVar14 = bottom_blob->data;
        sVar17 = bottom_blob->cstep;
        pvVar18 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar20 = 0;
        do {
          if (0 < (int)uVar25) {
            uVar23 = 0;
            do {
              *(float *)((long)pvVar18 + uVar23 * 4) = (float)(int)*(char *)((long)pvVar14 + uVar23)
              ;
              uVar23 = uVar23 + 1;
            } while (uVar25 != uVar23);
          }
          uVar20 = uVar20 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar3 * sVar4);
          pvVar14 = (void *)((long)pvVar14 + sVar17 * sVar5);
        } while (uVar20 != uVar16);
      }
      if (((this->super_Cast).type_from == 1) && ((this->super_Cast).type_to == 4)) {
        iVar13 = cpu_support_x86_avx2();
        auVar10 = _DAT_005f0860;
        auVar8 = _DAT_005f0840;
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar26 = 0;
            auVar31._8_8_ = 0x8000000000000000;
            auVar31._0_8_ = 0x8000000000000000;
            auVar30 = vpcmpeqd_avx(auVar30,auVar30);
            do {
              pauVar28 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar26 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar21 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar16 < 0x10) {
                uVar25 = 0;
              }
              else {
                iVar12 = 0xf;
                do {
                  auVar32 = vpsrld_avx(*pauVar28,0x10);
                  auVar33 = vpsrld_avx(pauVar28[1],0x10);
                  auVar32 = vpackusdw_avx(auVar32,auVar33);
                  auVar33 = vpsrld_avx(pauVar28[2],0x10);
                  auVar34 = vpsrld_avx(pauVar28[3],0x10);
                  auVar33 = vpackusdw_avx(auVar33,auVar34);
                  pauVar21[1] = auVar33;
                  *pauVar21 = auVar32;
                  pauVar28 = pauVar28 + 4;
                  pauVar21 = pauVar21 + 2;
                  iVar12 = iVar12 + 0x10;
                  uVar25 = uVar16 & 0xfffffff0;
                } while (iVar12 < (int)uVar16);
              }
              uVar24 = uVar25 | 7;
              while ((int)uVar24 < (int)uVar16) {
                auVar32 = vpsrld_avx(*pauVar28,0x10);
                auVar33 = vpsrld_avx(pauVar28[1],0x10);
                auVar32 = vpackusdw_avx(auVar32,auVar33);
                *pauVar21 = auVar32;
                pauVar28 = pauVar28 + 2;
                pauVar21 = pauVar21 + 1;
                uVar24 = uVar25 + 0xf;
                uVar25 = uVar25 + 8;
              }
              if ((int)uVar25 < (int)uVar16) {
                uVar20 = CONCAT44(0,~uVar25 + uVar16);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = uVar20;
                auVar34 = vpshufd_avx(auVar32,0x44);
                auVar32 = vorps_avx(auVar34,auVar31);
                auVar33 = vorps_avx(auVar34,auVar31);
                auVar34 = vorps_avx(auVar34,auVar31);
                uVar23 = 0;
                do {
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = uVar23;
                  auVar35 = vpshufd_avx(auVar35,0x44);
                  auVar37._16_16_ = auVar35;
                  auVar37._0_16_ = auVar35;
                  auVar6 = vorps_avx(auVar37,auVar8);
                  auVar37 = vorps_avx(auVar37,auVar10);
                  auVar36._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
                  auVar36._8_4_ = auVar37._24_4_;
                  auVar36._12_4_ = auVar37._28_4_ ^ 0x80000000;
                  auVar7 = vpcmpgtq_avx(auVar36,auVar32);
                  uVar9 = auVar37._0_8_;
                  auVar39._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar38._8_4_ = auVar37._8_4_;
                  auVar39._8_4_ = auVar38._8_4_;
                  uVar25 = auVar37._12_4_;
                  auVar39._12_4_ = uVar25 ^ 0x80000000;
                  auVar35 = vpcmpgtq_avx(auVar39,auVar33);
                  auVar35 = vpackssdw_avx(auVar35,auVar7);
                  auVar41._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
                  auVar41._8_4_ = auVar6._24_4_;
                  auVar41._12_4_ = auVar6._28_4_ ^ 0x80000000;
                  auVar39 = vpcmpgtq_avx(auVar41,auVar32);
                  auVar44._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar43._8_4_ = auVar6._8_4_;
                  auVar44._8_4_ = auVar43._8_4_;
                  auVar44._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar36 = vpcmpgtq_avx(auVar44,auVar34);
                  auVar36 = vpackssdw_avx(auVar36,auVar39);
                  auVar35 = vpackssdw_avx(auVar36 ^ auVar30,auVar35 ^ auVar30);
                  auVar36 = vpmovsxwd_avx(auVar35);
                  auVar41 = vpunpckhwd_avx(auVar35,auVar35);
                  auVar40._16_16_ = auVar41;
                  auVar40._0_16_ = auVar36;
                  auVar37 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])(*pauVar28 + uVar23 * 4));
                  if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2) = auVar37._2_2_;
                  }
                  auVar43._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar43._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar35 = vpcmpgtq_avx(auVar43,auVar34);
                  auVar35 = vpackssdw_avx(auVar35,auVar35);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 2) = auVar37._6_2_;
                  }
                  auVar35 = vpackssdw_avx(auVar39,auVar39);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 4) = auVar37._10_2_;
                  }
                  auVar35 = vpackssdw_avx(auVar39,auVar39);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 6) = auVar37._14_2_;
                  }
                  auVar42._8_4_ = auVar38._8_4_;
                  auVar42._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar42._12_4_ = uVar25 ^ 0x80000000;
                  auVar35 = vpcmpgtq_avx(auVar42,auVar33);
                  auVar35 = vpackssdw_avx(auVar35,auVar35);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 8) = auVar37._18_2_;
                  }
                  auVar38._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar38._12_4_ = uVar25 ^ 0x80000000;
                  auVar35 = vpcmpgtq_avx(auVar38,auVar33);
                  auVar35 = vpackssdw_avx(auVar35,auVar35);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 10) = auVar37._22_2_;
                  }
                  auVar35 = vpackssdw_avx(auVar7,auVar7);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 0xc) = auVar37._26_2_;
                  }
                  auVar35 = vpackssdw_avx(auVar7,auVar7);
                  auVar35 = vpackssdw_avx(auVar35 ^ auVar30,auVar35 ^ auVar30);
                  if ((auVar35 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 0xe) = auVar37._30_2_;
                  }
                  uVar23 = uVar23 + 8;
                } while ((uVar20 + 8 & 0xfffffffffffffff8) != uVar23);
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 != iVar13);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar13 = 0;
      if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
        iVar12 = cpu_support_x86_avx2();
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar26 = 0;
            auVar30 = ZEXT816(0) << 0x40;
            iVar13 = 0;
            do {
              pauVar28 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar26 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar21 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar16 < 8) {
                uVar25 = 0;
              }
              else {
                iVar22 = 7;
                do {
                  auVar32 = vpunpcklwd_avx(auVar30,*pauVar28);
                  auVar31 = vpunpckhwd_avx(auVar30,*pauVar28);
                  pauVar21[1] = auVar31;
                  *pauVar21 = auVar32;
                  pauVar28 = pauVar28 + 1;
                  pauVar21 = pauVar21 + 2;
                  iVar22 = iVar22 + 8;
                  uVar25 = uVar16 & 0xfffffff8;
                } while (iVar22 < (int)uVar16);
              }
              uVar24 = uVar25 | 3;
              while ((int)uVar24 < (int)uVar16) {
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)*pauVar28;
                auVar31 = vpunpcklwd_avx(auVar30,auVar33);
                *pauVar21 = auVar31;
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
                pauVar21 = pauVar21 + 1;
                uVar24 = uVar25 + 7;
                uVar25 = uVar25 + 4;
              }
              if (uVar16 - uVar25 != 0 && (int)uVar25 <= (int)uVar16) {
                lVar27 = 0;
                do {
                  *(uint *)(*pauVar21 + lVar27 * 4) =
                       (uint)*(ushort *)(*pauVar28 + lVar27 * 2) << 0x10;
                  lVar27 = lVar27 + 1;
                } while (uVar16 - uVar25 != (int)lVar27);
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 != iVar12);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}